

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_basis_file.cpp
# Opt level: O3

void __thiscall
basisu::basisu_file::create_comp_data(basisu_file *this,basisu_backend_output *encoder_output)

{
  uint8_vec *this_00;
  uint uVar1;
  uchar *puVar2;
  basis_slice_desc *__src;
  vector<unsigned_char> *pvVar3;
  uint uVar4;
  uint32_t uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  uVar1 = (this->m_comp_data).m_size;
  uVar8 = (ulong)uVar1;
  if (uVar8 == 0) {
    uVar8 = 0;
    uVar9 = 0x4d;
  }
  else {
    puVar2 = (this->m_comp_data).m_p;
    if (this < (basisu_file *)(puVar2 + uVar8) && puVar2 < &this->field_0x4d) goto LAB_00205dd8;
    if (0xffffffb2 < uVar1) goto LAB_00205ffd;
    uVar9 = uVar1 + 0x4d;
  }
  this_00 = &this->m_comp_data;
  uVar6 = uVar8;
  uVar4 = uVar1;
  if ((this->m_comp_data).m_capacity < uVar9) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this_00,uVar9,uVar1 + 1 == uVar9,1,(object_mover)0x0,false);
    uVar4 = (this->m_comp_data).m_size;
    uVar6 = (ulong)uVar4;
  }
  memset((this->m_comp_data).m_p + uVar6,0,(ulong)(uVar9 - uVar4));
  (this->m_comp_data).m_size = uVar9;
  if (uVar9 <= uVar1) goto LAB_00205fde;
  memcpy((this->m_comp_data).m_p + uVar8,this,0x4d);
  uVar1 = (this->m_comp_data).m_size;
  uVar8 = (ulong)uVar1;
  if (uVar1 != this->m_slice_descs_file_ofs) {
    __assert_fail("m_comp_data.size() == m_slice_descs_file_ofs",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                  ,0x98,"void basisu::basisu_file::create_comp_data(const basisu_backend_output &)")
    ;
  }
  uVar6 = (ulong)(this->m_images_descs).m_size;
  if (uVar6 == 0) {
    pcVar7 = 
    "T &basisu::vector<basist::basis_slice_desc>::operator[](size_t) [T = basist::basis_slice_desc]"
    ;
    goto LAB_00205ff3;
  }
  __src = (this->m_images_descs).m_p;
  if (uVar1 == 0) {
    uVar8 = 0;
  }
  else if (__src < (basis_slice_desc *)
                   ((((basis_slice_desc *)this_00->m_p)->m_image_index).m_bytes + uVar8) &&
           (basis_slice_desc *)this_00->m_p < __src + uVar6) goto LAB_00205dd8;
  uVar11 = uVar8 + uVar6 * 0x17;
  if (uVar11 >> 0x20 != 0) goto LAB_00205ffd;
  uVar9 = (uint)uVar11;
  if (uVar1 != uVar9) {
    if (uVar1 <= uVar9) {
      uVar11 = uVar8;
      uVar4 = uVar1;
      if ((this->m_comp_data).m_capacity < uVar9) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar9,uVar1 + 1 == uVar9,1,(object_mover)0x0,false);
        uVar4 = (this->m_comp_data).m_size;
        uVar11 = (ulong)uVar4;
      }
      memset(this_00->m_p + uVar11,0,(ulong)(uVar9 - uVar4));
    }
    (this->m_comp_data).m_size = uVar9;
    if (uVar1 < uVar9) {
      memcpy(this_00->m_p + uVar8,__src,uVar6 * 0x17);
      if (encoder_output->m_uses_global_codebooks == false) {
        uVar8 = (ulong)(encoder_output->m_endpoint_palette).m_size;
        if (uVar8 == 0) {
LAB_00205cad:
          uVar8 = (ulong)(encoder_output->m_selector_palette).m_size;
          if (uVar8 == 0) goto LAB_00205d8f;
          uVar1 = (this->m_comp_data).m_size;
          uVar6 = (ulong)uVar1;
          if (uVar1 != this->m_selector_cb_file_ofs) {
            __assert_fail("m_comp_data.size() == m_selector_cb_file_ofs",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                          ,0xa5,
                          "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)"
                         );
          }
          puVar2 = (encoder_output->m_selector_palette).m_p;
          if (uVar1 == 0) {
            uVar6 = 0;
          }
          else if (puVar2 < this_00->m_p + uVar6 && this_00->m_p < puVar2 + uVar8)
          goto LAB_00205dd8;
          if (uVar8 + uVar6 >> 0x20 != 0) goto LAB_00205ffd;
          uVar9 = (uint)(uVar8 + uVar6);
          if (uVar1 != uVar9) {
            if (uVar1 <= uVar9) {
              uVar11 = uVar6;
              uVar4 = uVar1;
              if ((this->m_comp_data).m_capacity < uVar9) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)this_00,uVar9,uVar1 + 1 == uVar9,1,(object_mover)0x0,
                           false);
                uVar4 = (this->m_comp_data).m_size;
                uVar11 = (ulong)uVar4;
              }
              memset(this_00->m_p + uVar11,0,(ulong)(uVar9 - uVar4));
            }
            (this->m_comp_data).m_size = uVar9;
            if (uVar1 < uVar9) {
              memcpy(this_00->m_p + uVar6,puVar2,uVar8);
              goto LAB_00205d8f;
            }
          }
        }
        else {
          uVar1 = (this->m_comp_data).m_size;
          uVar6 = (ulong)uVar1;
          if (uVar1 != this->m_endpoint_cb_file_ofs) {
            __assert_fail("m_comp_data.size() == m_endpoint_cb_file_ofs",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                          ,0x9f,
                          "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)"
                         );
          }
          puVar2 = (encoder_output->m_endpoint_palette).m_p;
          if (uVar1 == 0) {
            uVar6 = 0;
          }
          else if (puVar2 < this_00->m_p + uVar6 && this_00->m_p < puVar2 + uVar8)
          goto LAB_00205dd8;
          if (uVar8 + uVar6 >> 0x20 != 0) goto LAB_00205ffd;
          uVar9 = (uint)(uVar8 + uVar6);
          if (uVar1 != uVar9) {
            if (uVar1 <= uVar9) {
              uVar11 = uVar6;
              uVar4 = uVar1;
              if ((this->m_comp_data).m_capacity < uVar9) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)this_00,uVar9,uVar1 + 1 == uVar9,1,(object_mover)0x0,
                           false);
                uVar4 = (this->m_comp_data).m_size;
                uVar11 = (ulong)uVar4;
              }
              memset(this_00->m_p + uVar11,0,(ulong)(uVar9 - uVar4));
            }
            (this->m_comp_data).m_size = uVar9;
            if (uVar1 < uVar9) {
              memcpy(this_00->m_p + uVar6,puVar2,uVar8);
              goto LAB_00205cad;
            }
          }
        }
      }
      else {
LAB_00205d8f:
        uVar8 = (ulong)(encoder_output->m_slice_image_tables).m_size;
        if (uVar8 == 0) {
LAB_00205e8e:
          uVar5 = (this->m_comp_data).m_size;
          if (uVar5 != this->m_first_image_file_ofs) {
            __assert_fail("m_comp_data.size() == m_first_image_file_ofs",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                          ,0xb0,
                          "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)"
                         );
          }
          if ((encoder_output->m_slice_desc).m_size != 0) {
            lVar12 = 8;
            uVar8 = 0;
            do {
              if ((encoder_output->m_slice_image_data).m_size <= uVar8) {
                pcVar7 = 
                "const T &basisu::vector<basisu::vector<unsigned char>>::operator[](size_t) const [T = basisu::vector<unsigned char>]"
                ;
LAB_00206048:
                __assert_fail("i < m_size",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                              ,0x177,pcVar7);
              }
              pvVar3 = (encoder_output->m_slice_image_data).m_p;
              uVar6 = (ulong)*(uint *)((long)&pvVar3->m_p + lVar12);
              if (uVar6 == 0) {
                pcVar7 = 
                "const T &basisu::vector<unsigned char>::operator[](size_t) const [T = unsigned char]"
                ;
                goto LAB_00206048;
              }
              puVar2 = *(uchar **)((long)pvVar3 + lVar12 + -8);
              uVar1 = (this->m_comp_data).m_size;
              uVar11 = (ulong)uVar1;
              if (uVar11 == 0) {
                uVar11 = 0;
              }
              else if (puVar2 < this_00->m_p + uVar11 && this_00->m_p < puVar2 + uVar6)
              goto LAB_00205dd8;
              if (uVar6 + uVar11 >> 0x20 != 0) goto LAB_00205ffd;
              uVar9 = (uint)(uVar6 + uVar11);
              if (uVar1 == uVar9) goto LAB_00205fde;
              if (uVar1 <= uVar9) {
                uVar10 = uVar11;
                uVar4 = uVar1;
                if ((this->m_comp_data).m_capacity < uVar9) {
                  elemental_vector::increase_capacity
                            ((elemental_vector *)this_00,uVar9,uVar1 + 1 == uVar9,1,
                             (object_mover)0x0,false);
                  uVar4 = (this->m_comp_data).m_size;
                  uVar10 = (ulong)uVar4;
                }
                memset(this_00->m_p + uVar10,0,(ulong)(uVar9 - uVar4));
              }
              (this->m_comp_data).m_size = uVar9;
              if (uVar9 <= uVar1) goto LAB_00205fde;
              memcpy(this_00->m_p + uVar11,puVar2,uVar6);
              uVar8 = uVar8 + 1;
              lVar12 = lVar12 + 0x10;
            } while (uVar8 < (encoder_output->m_slice_desc).m_size);
            uVar5 = (this->m_comp_data).m_size;
          }
          if (uVar5 != this->m_total_file_size) {
            __assert_fail("m_comp_data.size() == m_total_file_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                          ,0xb4,
                          "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)"
                         );
          }
          return;
        }
        uVar1 = (this->m_comp_data).m_size;
        uVar6 = (ulong)uVar1;
        if (uVar1 != this->m_tables_file_ofs) {
          __assert_fail("m_comp_data.size() == m_tables_file_ofs",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                        ,0xac,
                        "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)")
          ;
        }
        puVar2 = (encoder_output->m_slice_image_tables).m_p;
        if (uVar1 == 0) {
          uVar6 = 0;
        }
        else if (puVar2 < this_00->m_p + uVar6 && this_00->m_p < puVar2 + uVar8) {
LAB_00205dd8:
          __assert_fail("(pObjs + n) <= vec.begin() || (pObjs >= vec.end())",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu.h"
                        ,0xb3,
                        "void basisu::append_vector(T &, const R *, size_t) [T = basisu::vector<unsigned char>, R = unsigned char]"
                       );
        }
        if (uVar8 + uVar6 >> 0x20 != 0) {
LAB_00205ffd:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                        ,0x217,
                        "void basisu::vector<unsigned char>::resize(size_t, bool) [T = unsigned char]"
                       );
        }
        uVar9 = (uint)(uVar8 + uVar6);
        if (uVar1 != uVar9) {
          if (uVar1 <= uVar9) {
            uVar11 = uVar6;
            uVar4 = uVar1;
            if ((this->m_comp_data).m_capacity < uVar9) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)this_00,uVar9,uVar1 + 1 == uVar9,1,(object_mover)0x0,
                         false);
              uVar4 = (this->m_comp_data).m_size;
              uVar11 = (ulong)uVar4;
            }
            memset(this_00->m_p + uVar11,0,(ulong)(uVar9 - uVar4));
          }
          (this->m_comp_data).m_size = uVar9;
          if (uVar1 < uVar9) {
            memcpy(this_00->m_p + uVar6,puVar2,uVar8);
            goto LAB_00205e8e;
          }
        }
      }
    }
  }
LAB_00205fde:
  pcVar7 = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
LAB_00205ff3:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x178,pcVar7);
}

Assistant:

void basisu_file::create_comp_data(const basisu_backend_output &encoder_output)
	{
		const basisu_backend_slice_desc_vec &slice_descs = encoder_output.m_slice_desc;

		append_vector(m_comp_data, reinterpret_cast<const uint8_t *>(&m_header), sizeof(m_header));

		assert(m_comp_data.size() == m_slice_descs_file_ofs);
		append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&m_images_descs[0]), m_images_descs.size() * sizeof(m_images_descs[0]));

		if (!encoder_output.m_uses_global_codebooks)
		{
			if (encoder_output.m_endpoint_palette.size())
			{
				assert(m_comp_data.size() == m_endpoint_cb_file_ofs);
				append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&encoder_output.m_endpoint_palette[0]), encoder_output.m_endpoint_palette.size());
			}

			if (encoder_output.m_selector_palette.size())
			{
				assert(m_comp_data.size() == m_selector_cb_file_ofs);
				append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&encoder_output.m_selector_palette[0]), encoder_output.m_selector_palette.size());
			}
		}

		if (encoder_output.m_slice_image_tables.size())
		{
			assert(m_comp_data.size() == m_tables_file_ofs);
			append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&encoder_output.m_slice_image_tables[0]), encoder_output.m_slice_image_tables.size());
		}

		assert(m_comp_data.size() == m_first_image_file_ofs);
		for (uint32_t i = 0; i < slice_descs.size(); i++)
			append_vector(m_comp_data, &encoder_output.m_slice_image_data[i][0], encoder_output.m_slice_image_data[i].size());

		assert(m_comp_data.size() == m_total_file_size);
	}